

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_uqadd_s8_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = (b & 0xff) + (int)(char)a;
  uVar1 = 0xff;
  if ((int)uVar4 < 0x100) {
    if ((int)uVar4 < 0) {
      uVar1 = 0;
      goto LAB_005b7822;
    }
  }
  else {
LAB_005b7822:
    uVar4 = uVar1;
    (env->vfp).qc[0] = 1;
  }
  uVar5 = (b >> 8 & 0xff) + (int)(char)(a >> 8);
  uVar1 = 0xff;
  if ((int)uVar5 < 0x100) {
    if ((int)uVar5 < 0) {
      uVar1 = 0;
      goto LAB_005b7854;
    }
  }
  else {
LAB_005b7854:
    uVar5 = uVar1;
    (env->vfp).qc[0] = 1;
  }
  uVar6 = (b >> 0x10 & 0xff) + (int)(char)(a >> 0x10);
  uVar1 = 0xff;
  if ((int)uVar6 < 0x100) {
    if ((int)uVar6 < 0) {
      uVar1 = 0;
      goto LAB_005b788c;
    }
  }
  else {
LAB_005b788c:
    uVar6 = uVar1;
    (env->vfp).qc[0] = 1;
  }
  iVar3 = (b >> 0x18) + ((int)a >> 0x18);
  iVar2 = 0xff;
  if (iVar3 < 0x100) {
    if (-1 < iVar3) goto LAB_005b78bf;
    iVar2 = 0;
  }
  iVar3 = iVar2;
  (env->vfp).qc[0] = 1;
LAB_005b78bf:
  return iVar3 << 0x18 | (uVar6 & 0xff) << 0x10 | (uVar5 & 0xff) << 8 | uVar4;
}

Assistant:

uint32_t HELPER(neon_uqadd_s8)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int16_t va, vb, vr;
    uint32_t r = 0;

    USATACC(8, 0);
    USATACC(8, 8);
    USATACC(8, 16);
    USATACC(8, 24);
    return r;
}